

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pragma_queries.cpp
# Opt level: O3

string * __thiscall
duckdb::PragmaTableInfo_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,ClientContext *context,
          FunctionParameters *parameters)

{
  const_reference this_00;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  string local_58;
  string local_38;
  
  local_78[0] = local_68;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,"SELECT * FROM pragma_table_info(%s);","");
  this_00 = vector<duckdb::Value,_true>::operator[]((vector<duckdb::Value,_true> *)context,0);
  Value::ToString_abi_cxx11_(&local_58,this_00);
  KeywordHelper::WriteQuoted(&local_38,&local_58,'\'');
  StringUtil::Format<std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_78,&local_38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)parameters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_78[0] != local_68) {
    operator_delete(local_78[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string PragmaTableInfo(ClientContext &context, const FunctionParameters &parameters) {
	return StringUtil::Format("SELECT * FROM pragma_table_info(%s);",
	                          KeywordHelper::WriteQuoted(parameters.values[0].ToString(), '\''));
}